

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lights.cpp
# Opt level: O2

LightBounds * pbrt::Union(LightBounds *__return_storage_ptr__,LightBounds *a,LightBounds *b)

{
  Float FVar1;
  Float FVar2;
  undefined1 auVar3 [16];
  undefined8 uVar4;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 uVar7;
  undefined1 auVar8 [56];
  undefined1 auVar5 [64];
  undefined1 auVar6 [64];
  undefined8 uVar11;
  undefined8 uVar12;
  undefined8 uVar13;
  undefined8 uVar14;
  Vector3<float> VVar15;
  DirectionCone cone;
  DirectionCone local_78;
  undefined1 local_60 [24];
  DirectionCone local_48;
  
  if ((a->phi != 0.0) || (NAN(a->phi))) {
    if ((b->phi != 0.0) || (NAN(b->phi))) {
      FVar1 = a->cosTheta_o;
      local_78.w.super_Tuple3<pbrt::Vector3,_float>.x = (a->w).super_Tuple3<pbrt::Vector3,_float>.x;
      local_78.w.super_Tuple3<pbrt::Vector3,_float>.y = (a->w).super_Tuple3<pbrt::Vector3,_float>.y;
      auVar8 = ZEXT856(0);
      local_78.w.super_Tuple3<pbrt::Vector3,_float>.z = (a->w).super_Tuple3<pbrt::Vector3,_float>.z;
      VVar15 = Normalize<float>(&local_78.w);
      local_60._8_4_ = VVar15.super_Tuple3<pbrt::Vector3,_float>.z;
      auVar5._0_8_ = VVar15.super_Tuple3<pbrt::Vector3,_float>._0_8_;
      auVar5._8_56_ = auVar8;
      local_60._0_8_ = vmovlps_avx(auVar5._0_16_);
      local_60[0x10] = false;
      FVar2 = b->cosTheta_o;
      local_78.w.super_Tuple3<pbrt::Vector3,_float>.x = (b->w).super_Tuple3<pbrt::Vector3,_float>.x;
      local_78.w.super_Tuple3<pbrt::Vector3,_float>.y = (b->w).super_Tuple3<pbrt::Vector3,_float>.y;
      auVar8 = ZEXT856(0);
      local_78.w.super_Tuple3<pbrt::Vector3,_float>.z = (b->w).super_Tuple3<pbrt::Vector3,_float>.z;
      local_60._12_4_ = FVar1;
      VVar15 = Normalize<float>(&local_78.w);
      local_48.w.super_Tuple3<pbrt::Vector3,_float>.z = VVar15.super_Tuple3<pbrt::Vector3,_float>.z;
      auVar6._0_8_ = VVar15.super_Tuple3<pbrt::Vector3,_float>._0_8_;
      auVar6._8_56_ = auVar8;
      local_48.w.super_Tuple3<pbrt::Vector3,_float>._0_8_ = vmovlps_avx(auVar6._0_16_);
      local_48.empty = false;
      local_48.cosTheta = FVar2;
      Union(&local_78,(DirectionCone *)local_60,&local_48);
      auVar3 = vminss_avx(ZEXT416((uint)b->cosTheta_e),ZEXT416((uint)a->cosTheta_e));
      Union<float>((Bounds3<float> *)local_60,&a->bounds,&b->bounds);
      LightBounds::LightBounds
                (__return_storage_ptr__,(Bounds3<float> *)local_60,&local_78.w,a->phi + b->phi,
                 local_78.cosTheta,auVar3._0_4_,(bool)(b->twoSided | a->twoSided));
      return __return_storage_ptr__;
    }
    uVar4._0_4_ = (a->bounds).pMin.super_Tuple3<pbrt::Point3,_float>.x;
    uVar4._4_4_ = (a->bounds).pMin.super_Tuple3<pbrt::Point3,_float>.y;
    uVar7 = *(undefined8 *)&(a->bounds).pMin.super_Tuple3<pbrt::Point3,_float>.z;
    uVar9._0_4_ = (a->bounds).pMax.super_Tuple3<pbrt::Point3,_float>.y;
    uVar9._4_4_ = (a->bounds).pMax.super_Tuple3<pbrt::Point3,_float>.z;
    uVar10._0_4_ = a->phi;
    uVar10._4_4_ = (a->w).super_Tuple3<pbrt::Vector3,_float>.x;
    uVar11 = *(undefined8 *)&(a->bounds).pMax.super_Tuple3<pbrt::Point3,_float>.z;
    uVar12._0_4_ = (a->w).super_Tuple3<pbrt::Vector3,_float>.x;
    uVar12._4_4_ = (a->w).super_Tuple3<pbrt::Vector3,_float>.y;
    uVar13 = *(undefined8 *)&(a->w).super_Tuple3<pbrt::Vector3,_float>.z;
    uVar14._0_4_ = a->cosTheta_e;
    uVar14._4_1_ = a->twoSided;
    uVar14._5_3_ = *(undefined3 *)&a->field_0x31;
  }
  else {
    uVar4._0_4_ = (b->bounds).pMin.super_Tuple3<pbrt::Point3,_float>.x;
    uVar4._4_4_ = (b->bounds).pMin.super_Tuple3<pbrt::Point3,_float>.y;
    uVar7 = *(undefined8 *)&(b->bounds).pMin.super_Tuple3<pbrt::Point3,_float>.z;
    uVar9._0_4_ = (b->bounds).pMax.super_Tuple3<pbrt::Point3,_float>.y;
    uVar9._4_4_ = (b->bounds).pMax.super_Tuple3<pbrt::Point3,_float>.z;
    uVar10._0_4_ = b->phi;
    uVar10._4_4_ = (b->w).super_Tuple3<pbrt::Vector3,_float>.x;
    uVar11 = *(undefined8 *)&(b->bounds).pMax.super_Tuple3<pbrt::Point3,_float>.z;
    uVar12._0_4_ = (b->w).super_Tuple3<pbrt::Vector3,_float>.x;
    uVar12._4_4_ = (b->w).super_Tuple3<pbrt::Vector3,_float>.y;
    uVar13 = *(undefined8 *)&(b->w).super_Tuple3<pbrt::Vector3,_float>.z;
    uVar14._0_4_ = b->cosTheta_e;
    uVar14._4_1_ = b->twoSided;
    uVar14._5_3_ = *(undefined3 *)&b->field_0x31;
  }
  *(undefined8 *)&(__return_storage_ptr__->bounds).pMax.super_Tuple3<pbrt::Point3,_float>.z = uVar11
  ;
  (__return_storage_ptr__->w).super_Tuple3<pbrt::Vector3,_float>.x = (float)(int)uVar12;
  (__return_storage_ptr__->w).super_Tuple3<pbrt::Vector3,_float>.y =
       (float)(int)((ulong)uVar12 >> 0x20);
  *(undefined8 *)&(__return_storage_ptr__->w).super_Tuple3<pbrt::Vector3,_float>.z = uVar13;
  __return_storage_ptr__->cosTheta_e = (Float)(int)uVar14;
  __return_storage_ptr__->twoSided = (bool)(char)((ulong)uVar14 >> 0x20);
  *(int3 *)&__return_storage_ptr__->field_0x31 = (int3)((ulong)uVar14 >> 0x28);
  (__return_storage_ptr__->bounds).pMin.super_Tuple3<pbrt::Point3,_float>.x = (float)(int)uVar4;
  (__return_storage_ptr__->bounds).pMin.super_Tuple3<pbrt::Point3,_float>.y =
       (float)(int)((ulong)uVar4 >> 0x20);
  *(undefined8 *)&(__return_storage_ptr__->bounds).pMin.super_Tuple3<pbrt::Point3,_float>.z = uVar7;
  (__return_storage_ptr__->bounds).pMax.super_Tuple3<pbrt::Point3,_float>.y = (float)(int)uVar9;
  (__return_storage_ptr__->bounds).pMax.super_Tuple3<pbrt::Point3,_float>.z =
       (float)(int)((ulong)uVar9 >> 0x20);
  __return_storage_ptr__->phi = (Float)(int)uVar10;
  (__return_storage_ptr__->w).super_Tuple3<pbrt::Vector3,_float>.x =
       (float)(int)((ulong)uVar10 >> 0x20);
  return __return_storage_ptr__;
}

Assistant:

LightBounds Union(const LightBounds &a, const LightBounds &b) {
    // If one _LightBounds_ has zero power, return the other
    if (a.phi == 0)
        return b;
    if (b.phi == 0)
        return a;

    // Find average direction and updated angles for _LightBounds_
    DirectionCone cone =
        Union(DirectionCone(a.w, a.cosTheta_o), DirectionCone(b.w, b.cosTheta_o));
    Float cosTheta_o = cone.cosTheta;
    Float cosTheta_e = std::min(a.cosTheta_e, b.cosTheta_e);

    // Return final _LightBounds_ union
    return LightBounds(Union(a.bounds, b.bounds), cone.w, a.phi + b.phi, cosTheta_o,
                       cosTheta_e, a.twoSided | b.twoSided);
}